

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.cpp
# Opt level: O2

int SendNbSimpleMessageAndWaitNsMDM(MDM *pMDM,BOOL *pbError,int n,int nb,int msgid,char *msg)

{
  int iVar1;
  int iVar2;
  uint8 buf [4];
  timeval local_48;
  BOOL *local_38;
  
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  local_38 = pbError;
  if (msg[3] == '\0') {
    strcpy((char *)buf,msg);
  }
  else {
    buf = *(uint8 (*) [4])msg;
  }
  if (nb < 1) {
    nb = 0;
  }
  iVar2 = nb + 1;
  while( true ) {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return 0;
    }
    iVar1 = SendAllDataMDM(pMDM,buf,4);
    if (iVar1 != 0) break;
    iVar1 = gettimeofday(&local_48,(__timezone_ptr_t)0x0);
    if (iVar1 != 0) {
      local_48.tv_sec = 0;
      local_48.tv_usec = 0;
    }
    if (pMDM->bSaveRawData != 0) {
      fprintf((FILE *)pMDM->pfSaveFile,"%d;%d;%d;%c;%.4s;\n",local_48.tv_sec & 0xffffffff,
              local_48.tv_usec & 0xffffffff,(ulong)(uint)msgid,0x73,buf);
      fflush((FILE *)pMDM->pfSaveFile);
    }
    iVar1 = WaitNsMDM(n);
    if (iVar1 != 0) {
      return 1;
    }
  }
  *local_38 = 1;
  return 1;
}

Assistant:

inline int SendNbSimpleMessageAndWaitNsMDM(MDM* pMDM, BOOL* pbError, int n, int nb, int msgid, char* msg)
{
	uint8 buf[4];
	int i = 0;
	struct timeval tv;

	memset(buf, 0, sizeof(buf));
	if (msg[3] == 0) strcpy((char*)buf, msg); else memcpy(buf, msg, sizeof(buf));
	for (i = 0; i < nb; i++)
	{
		if (SendAllDataMDM(pMDM, buf, sizeof(buf)) != EXIT_SUCCESS)
		{
			*pbError = TRUE;
			return EXIT_FAILURE;
		}
		if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
		if (pMDM->bSaveRawData)
		{
			fprintf(pMDM->pfSaveFile, "%d;%d;%d;%c;%.4s;\n", (int)tv.tv_sec, (int)tv.tv_usec, msgid, 's', buf);
			fflush(pMDM->pfSaveFile);
		}
		if (WaitNsMDM(n) != EXIT_SUCCESS) return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}